

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress1X_DCtx_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize)

{
  U32 UVar1;
  size_t sVar2;
  undefined8 uStack_50;
  
  if (dstSize == 0) {
    uStack_50 = 0xffffffffffffffba;
    dstSize = uStack_50;
  }
  else if (dstSize < cSrcSize) {
    uStack_50 = 0xffffffffffffffec;
    dstSize = uStack_50;
  }
  else if (cSrcSize == dstSize) {
    memcpy(dst,cSrc,dstSize);
  }
  else if (cSrcSize == 1) {
    memset(dst,(uint)*cSrc,dstSize);
  }
  else {
    UVar1 = HUF_selectDecoder(dstSize,cSrcSize);
    if (UVar1 != 0) {
      sVar2 = HUF_decompress1X2_DCtx_wksp(dctx,dst,dstSize,cSrc,cSrcSize,workSpace,wkspSize);
      return sVar2;
    }
    dstSize = HUF_decompress1X1_DCtx_wksp(dctx,dst,dstSize,cSrc,cSrcSize,workSpace,wkspSize);
  }
  return dstSize;
}

Assistant:

size_t HUF_decompress1X_DCtx_wksp(HUF_DTable* dctx, void* dst, size_t dstSize,
                                  const void* cSrc, size_t cSrcSize,
                                  void* workSpace, size_t wkspSize)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { ZSTD_memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { ZSTD_memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress1X1_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress1X2_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize);
#else
        return algoNb ? HUF_decompress1X2_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize):
                        HUF_decompress1X1_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize);
#endif
    }
}